

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *printer)

{
  bool bVar1;
  Printer *name;
  int in_ESI;
  NamespaceOpener *in_RDI;
  Printer *in_stack_00000028;
  CrossFileReferences *in_stack_00000030;
  SCC *in_stack_00000038;
  FileGenerator *in_stack_00000040;
  NamespaceOpener proto_ns;
  NamespaceOpener ns;
  Descriptor *message;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range3;
  CrossFileReferences refs;
  Formatter format;
  Printer *in_stack_fffffffffffffda8;
  FileGenerator *in_stack_fffffffffffffdb0;
  Formatter *format_00;
  Options *in_stack_fffffffffffffdd8;
  NamespaceOpener *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  Formatter *in_stack_fffffffffffffdf0;
  Printer *in_stack_fffffffffffffe18;
  MessageGenerator *in_stack_fffffffffffffe20;
  Options *in_stack_fffffffffffffe50;
  NamespaceOpener *in_stack_fffffffffffffe58;
  __normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  local_188;
  Printer *printer_00;
  int in_stack_fffffffffffffe8c;
  FileGenerator *in_stack_fffffffffffffe90;
  
  Formatter::Formatter
            ((Formatter *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d7577);
  GenerateSourceIncludes
            ((FileGenerator *)
             proto_ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (Printer *)
             proto_ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)in_stack_fffffffffffffdb0);
  format_00 = (Formatter *)
              &in_RDI[7].name_stack_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)&in_RDI[0x12].name_stack_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std::
  unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::operator->((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                *)0x4d75c7);
  name = (Printer *)
         MessageSCCAnalyzer::GetSCC
                   ((MessageSCCAnalyzer *)in_stack_fffffffffffffdb0,
                    (Descriptor *)in_stack_fffffffffffffda8);
  printer_00 = name;
  local_188._M_current =
       (Descriptor **)
       std::
       vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)in_stack_fffffffffffffda8);
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)in_stack_fffffffffffffda8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                             *)in_stack_fffffffffffffdb0,
                            (__normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                             *)in_stack_fffffffffffffda8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
    ::operator*(&local_188);
    in_stack_fffffffffffffe58 = in_RDI;
    ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
              ((Descriptor *)in_stack_fffffffffffffde0,
               (anon_class_16_2_3fe543fb *)in_stack_fffffffffffffdd8);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::Descriptor_*const_*,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
    ::operator++(&local_188);
  }
  GenerateInternalForwardDeclarations
            ((FileGenerator *)__begin3._M_current,(CrossFileReferences *)__end3._M_current,
             (Printer *)message);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)&in_RDI[0x12].name_stack_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std::
  unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::operator->((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                *)0x4d76ff);
  bVar1 = IsSCCRepresentative(in_stack_fffffffffffffdb0,(Descriptor *)in_stack_fffffffffffffda8);
  if (bVar1) {
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                  *)&in_RDI[0x12].name_stack_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
    std::
    unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
    ::operator->((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                  *)0x4d773d);
    in_stack_fffffffffffffdb0 =
         (FileGenerator *)GetSCC(in_stack_fffffffffffffdb0,(Descriptor *)in_stack_fffffffffffffda8);
    GenerateInitForSCC(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  Namespace_abi_cxx11_((FileDescriptor *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  NamespaceOpener::NamespaceOpener(in_RDI,(string *)name,format_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  GenerateSourceDefaultInstance(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,printer_00);
  Formatter::operator()<>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)&in_RDI[0x12].name_stack_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std::
  unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::operator->((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                *)0x4d7805);
  MessageGenerator::GenerateClassMethods
            ((MessageGenerator *)refs.weak_sccs._M_h._M_element_count,
             (Printer *)refs.weak_sccs._M_h._M_before_begin._M_nxt);
  Formatter::operator()<>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  NamespaceOpener::~NamespaceOpener(in_stack_fffffffffffffde0);
  ProtobufNamespace_abi_cxx11_(in_stack_fffffffffffffdd8);
  NamespaceOpener::NamespaceOpener(in_RDI,(string *)name,format_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)&in_RDI[0x12].name_stack_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  std::
  unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::operator->((unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                *)0x4d7893);
  MessageGenerator::GenerateSourceInProto2Namespace
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  NamespaceOpener::~NamespaceOpener(in_stack_fffffffffffffde0);
  Formatter::operator()<>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)in_stack_fffffffffffffdb0);
  Formatter::~Formatter((Formatter *)0x4d78df);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  // Generate weak declarations. We do this for the whole strongly-connected
  // component (SCC), because we have a single InitDefaults* function for the
  // SCC.
  CrossFileReferences refs;
  for (const Descriptor* message :
       scc_analyzer_.GetSCC(message_generators_[idx]->descriptor_)
           ->descriptors) {
    ForEachField(message, [this, &refs](const FieldDescriptor* field) {
      GetCrossFileReferencesForField(field, &refs);
    });
  }
  GenerateInternalForwardDeclarations(refs, printer);

  if (IsSCCRepresentative(message_generators_[idx]->descriptor_)) {
    GenerateInitForSCC(GetSCC(message_generators_[idx]->descriptor_), refs,
                       printer);
  }

  {  // package namespace
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    GenerateSourceDefaultInstance(idx, printer);

    // Generate classes.
    format("\n");
    message_generators_[idx]->GenerateClassMethods(printer);

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }  // end package namespace

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    message_generators_[idx]->GenerateSourceInProto2Namespace(printer);
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}